

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall imrt::Station::clearHistory(Station *this)

{
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *in_RDI;
  type in_stack_ffffffffffffffb8;
  
  std::make_pair<int,int>((int *)in_stack_ffffffffffffffb8,(int *)0x13d272);
  std::make_pair<int,int>((int *)in_stack_ffffffffffffffb8,(int *)0x13d296);
  std::make_pair<std::pair<int,int>,std::pair<int,int>>
            (&in_RDI->first,&in_stack_ffffffffffffffb8->first);
  std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::clear
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x13d2e9);
  return;
}

Assistant:

void Station::clearHistory() {
    last_mem= make_pair(make_pair(-1,-1), make_pair(-1,-1));
    last_diff.clear();
    last_intensity.clear();
  }